

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientUtils.cpp
# Opt level: O0

string * ClientUtils::AdaptDeviceName
                   (string *__return_storage_ptr__,string *i_rDeviceName,uint i_DeviceID)

{
  ulong uVar1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  uint local_1c;
  string *psStack_18;
  uint i_DeviceID_local;
  string *i_rDeviceName_local;
  
  local_1c = i_DeviceID;
  psStack_18 = i_rDeviceName;
  i_rDeviceName_local = __return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psStack_18);
  }
  else {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (&local_100,"Unnamed Device %d");
    this = boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                     ((basic_format<char,std::char_traits<char>,std::allocator<char>> *)&local_100,
                      &local_1c);
    boost::str<char,std::char_traits<char>,std::allocator<char>>
              (__return_storage_ptr__,(boost *)this,
               (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(extraout_var,extraout_EDX));
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
              (&local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AdaptDeviceName( const std::string & i_rDeviceName, 
                               const unsigned int  i_DeviceID )
  {
    if( !i_rDeviceName.empty() )
    {
      return i_rDeviceName;
    }
    else
    {
      return str( boost::format( "Unnamed Device %d" ) % i_DeviceID );
    }
  }